

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::updateDirtyRegions(QMdiSubWindowPrivate *this)

{
  long lVar1;
  bool bVar2;
  QRegion *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *in_stack_00000018;
  iterator end;
  iterator it;
  QRegion *in_stack_ffffffffffffffc8;
  QRegion in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((iterator *)&in_RDI[2].d)->_M_node != (_Base_ptr)0x0) {
    QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::begin
              ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)
               in_stack_ffffffffffffffe0.d);
    QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::end
              ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)
               in_stack_ffffffffffffffe0.d);
    while( true ) {
      bVar2 = ::operator!=((iterator *)in_RDI,(iterator *)in_stack_ffffffffffffffc8);
      if (!bVar2) break;
      QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::iterator::key
                ((iterator *)0x62e0a4);
      getRegion(in_stack_00000018,this._4_4_);
      QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::iterator::value
                ((iterator *)0x62e0bf);
      QRegion::operator=(in_RDI,in_stack_ffffffffffffffc8);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffffe0);
      QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::iterator::
      operator++((iterator *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::updateDirtyRegions()
{
    // No update necessary
    if (!parent)
        return;

    for (OperationInfoMap::iterator it = operationMap.begin(), end = operationMap.end(); it != end; ++it)
        it.value().region = getRegion(it.key());
}